

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int session_call_error_callback(nghttp2_session *session,int lib_error_code,char *fmt,...)

{
  nghttp2_mem *mem;
  nghttp2_error_callback2 p_Var1;
  char in_AL;
  int iVar2;
  char *__s;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  if (((session->callbacks).error_callback != (nghttp2_error_callback)0x0) ||
     ((session->callbacks).error_callback2 != (nghttp2_error_callback2)0x0)) {
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_108 = 0x3000000018;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    iVar2 = vsnprintf((char *)0x0,0,fmt,&local_108);
    if (iVar2 < 0) {
      return -0x385;
    }
    mem = &session->mem;
    __s = (char *)nghttp2_mem_malloc(mem,(ulong)(iVar2 + 1));
    if (__s == (char *)0x0) {
      return -0x385;
    }
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_108 = 0x3000000018;
    iVar2 = vsnprintf(__s,(ulong)(iVar2 + 1),fmt,&local_108);
    if (-1 < iVar2) {
      p_Var1 = (session->callbacks).error_callback2;
      if (p_Var1 == (nghttp2_error_callback2)0x0) {
        iVar2 = (*(session->callbacks).error_callback)(session,__s,(size_t)iVar2,session->user_data)
        ;
      }
      else {
        iVar2 = (*p_Var1)(session,lib_error_code,__s,(size_t)iVar2,session->user_data);
      }
      nghttp2_mem_free(mem,__s);
      if (iVar2 != 0) {
        return -0x386;
      }
      return 0;
    }
    nghttp2_mem_free(mem,__s);
  }
  return 0;
}

Assistant:

static int session_call_error_callback(nghttp2_session *session,
                                       int lib_error_code, const char *fmt,
                                       ...) {
  size_t bufsize;
  va_list ap;
  char *buf;
  int rv;
  nghttp2_mem *mem;

  if (!session->callbacks.error_callback &&
      !session->callbacks.error_callback2) {
    return 0;
  }

  mem = &session->mem;

  va_start(ap, fmt);
  rv = vsnprintf(NULL, 0, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    return NGHTTP2_ERR_NOMEM;
  }

  bufsize = (size_t)(rv + 1);

  buf = nghttp2_mem_malloc(mem, bufsize);
  if (buf == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  va_start(ap, fmt);
  rv = vsnprintf(buf, bufsize, fmt, ap);
  va_end(ap);

  if (rv < 0) {
    nghttp2_mem_free(mem, buf);
    /* vsnprintf may return error because of various things we can
       imagine, but typically we don't want to drop session just for
       debug callback. */
    DEBUGF("error_callback: vsnprintf failed. The template was %s\n", fmt);
    return 0;
  }

  if (session->callbacks.error_callback2) {
    rv = session->callbacks.error_callback2(session, lib_error_code, buf,
                                            (size_t)rv, session->user_data);
  } else {
    rv = session->callbacks.error_callback(session, buf, (size_t)rv,
                                           session->user_data);
  }

  nghttp2_mem_free(mem, buf);

  if (rv != 0) {
    return NGHTTP2_ERR_CALLBACK_FAILURE;
  }

  return 0;
}